

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextBlock>::moveAppend
          (QGenericArrayOps<QTextBlock> *this,QTextBlock *b,QTextBlock *e)

{
  long lVar1;
  int *piVar2;
  
  if (b != e) {
    lVar1 = (this->super_QArrayDataPointer<QTextBlock>).size;
    piVar2 = &(this->super_QArrayDataPointer<QTextBlock>).ptr[lVar1].n;
    for (; lVar1 = lVar1 + 1, b < e; b = b + 1) {
      ((QTextBlock *)(piVar2 + -2))->p = b->p;
      *piVar2 = b->n;
      (this->super_QArrayDataPointer<QTextBlock>).size = lVar1;
      piVar2 = piVar2 + 4;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }